

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlFAParsePiece(xmlRegParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlRegStatePtr from;
  xmlRegStatePtr pxVar2;
  xmlRegStatePtr pxVar3;
  byte *pbVar4;
  xmlChar *pxVar5;
  int in_EAX;
  uint uVar6;
  int iVar7;
  int iVar8;
  xmlRegAtomPtr pxVar9;
  xmlRegQuantType xVar10;
  char *extra;
  int local_38 [2];
  
  ctxt->atom = (xmlRegAtomPtr)0x0;
  local_38[1] = 4;
  local_38[0] = in_EAX;
  uVar6 = xmlGetUTF8Char(ctxt->cur,local_38 + 1);
  if ((int)uVar6 < 0) {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"Invalid UTF-8");
LAB_0017fe02:
    pbVar4 = ctxt->cur;
    bVar1 = *pbVar4;
    if (bVar1 < 0x5b) {
      if (bVar1 == 0x28) {
        ctxt->cur = pbVar4 + 1;
        if (0x31 < ctxt->depth) {
          ctxt->error = 0x5aa;
          extra = "xmlFAParseAtom: maximum nesting depth exceeded";
          goto LAB_0017fef6;
        }
        xmlFAGenerateEpsilonTransition(ctxt,ctxt->state,(xmlRegStatePtr)0x0);
        from = ctxt->state;
        xmlFAGenerateEpsilonTransition(ctxt,from,(xmlRegStatePtr)0x0);
        pxVar2 = ctxt->end;
        pxVar3 = ctxt->state;
        ctxt->end = (xmlRegStatePtr)0x0;
        ctxt->atom = (xmlRegAtomPtr)0x0;
        ctxt->depth = ctxt->depth + 1;
        xmlFAParseRegExp(ctxt,0);
        ctxt->depth = ctxt->depth + -1;
        if (*ctxt->cur == ')') {
          ctxt->cur = ctxt->cur + 1;
        }
        else {
          ctxt->error = 0x5aa;
          xmlRegexpErrCompile(ctxt,"xmlFAParseAtom: expecting \')\'");
        }
        pxVar9 = xmlRegNewAtom(ctxt,XML_REGEXP_SUBREG);
        ctxt->atom = pxVar9;
        if (pxVar9 != (xmlRegAtomPtr)0x0) {
          pxVar9->start = pxVar3;
          pxVar9->start0 = from;
          pxVar9->stop = ctxt->state;
          ctxt->end = pxVar2;
        }
      }
      else {
        if (bVar1 != 0x2e) {
          return 0;
        }
LAB_0017fe29:
        xmlFAParseCharClassEsc(ctxt);
      }
    }
    else {
      if (bVar1 != 0x5b) {
        if (bVar1 != 0x5c) {
          return 0;
        }
        goto LAB_0017fe29;
      }
      ctxt->cur = pbVar4 + 1;
      pxVar9 = xmlRegNewAtom(ctxt,XML_REGEXP_RANGES);
      ctxt->atom = pxVar9;
      if (pxVar9 != (xmlRegAtomPtr)0x0) {
        xmlFAParseCharGroup(ctxt);
        if (*ctxt->cur != ']') {
          ctxt->error = 0x5aa;
          extra = "xmlFAParseCharClass: \']\' expected";
          goto LAB_0017fef6;
        }
        ctxt->cur = ctxt->cur + 1;
      }
    }
  }
  else {
    if ((((uVar6 & 0x7ffffffc) == 0x28) ||
        ((uVar6 - 0x5b < 0x22 && ((0x200000007U >> ((ulong)(uVar6 - 0x5b) & 0x3f) & 1) != 0)))) ||
       ((uVar6 < 0x40 && ((0x8000400000000001U >> ((ulong)uVar6 & 0x3f) & 1) != 0))))
    goto LAB_0017fe02;
    pxVar9 = xmlRegNewAtom(ctxt,XML_REGEXP_CHARVAL);
    ctxt->atom = pxVar9;
    if (pxVar9 != (xmlRegAtomPtr)0x0) {
      local_38[0] = 4;
      iVar7 = xmlGetUTF8Char(ctxt->cur,local_38);
      if (-1 < iVar7) {
        ctxt->atom->codepoint = iVar7;
        ctxt->cur = ctxt->cur + local_38[0];
        goto LAB_0017ff40;
      }
      ctxt->error = 0x5aa;
      extra = "Invalid UTF-8";
LAB_0017fef6:
      xmlRegexpErrCompile(ctxt,extra);
    }
  }
LAB_0017ff40:
  if (ctxt->atom == (xmlRegAtomPtr)0x0) {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"internal: no atom generated");
  }
  pbVar4 = ctxt->cur;
  bVar1 = *pbVar4;
  if (1 < bVar1 - 0x2a) {
    if (bVar1 == 0x7b) {
      ctxt->cur = pbVar4 + 1;
      iVar7 = xmlFAParseQuantExact(ctxt);
      if (iVar7 < 0) {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"Improper quantifier");
        iVar7 = 0;
      }
      pxVar5 = ctxt->cur;
      iVar8 = 0;
      if (*pxVar5 == ',') {
        ctxt->cur = pxVar5 + 1;
        iVar8 = 0x7fffffff;
        if ((pxVar5[1] != '}') && (iVar8 = xmlFAParseQuantExact(ctxt), iVar8 < 0)) {
          ctxt->error = 0x5aa;
          xmlRegexpErrCompile(ctxt,"Improper quantifier");
          iVar8 = 0;
        }
      }
      if (*ctxt->cur == '}') {
        ctxt->cur = ctxt->cur + 1;
      }
      else {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"Unterminated quantifier");
      }
      pxVar9 = ctxt->atom;
      if (pxVar9 != (xmlRegAtomPtr)0x0) {
        if (iVar8 == 0) {
          iVar8 = iVar7;
        }
        pxVar9->quant = XML_REGEXP_QUANT_RANGE;
        pxVar9->min = iVar7;
        pxVar9->max = iVar8;
        return 1;
      }
      return 1;
    }
    if (bVar1 != 0x3f) {
      return 1;
    }
  }
  if (ctxt->atom != (xmlRegAtomPtr)0x0) {
    if (bVar1 == 0x3f) {
      xVar10 = XML_REGEXP_QUANT_OPT;
    }
    else if (bVar1 == 0x2b) {
      xVar10 = XML_REGEXP_QUANT_PLUS;
    }
    else {
      if (bVar1 != 0x2a) goto LAB_00180080;
      xVar10 = XML_REGEXP_QUANT_MULT;
    }
    ctxt->atom->quant = xVar10;
  }
LAB_00180080:
  ctxt->cur = pbVar4 + 1;
  return 1;
}

Assistant:

static int
xmlFAParsePiece(xmlRegParserCtxtPtr ctxt) {
    int ret;

    ctxt->atom = NULL;
    ret = xmlFAParseAtom(ctxt);
    if (ret == 0)
	return(0);
    if (ctxt->atom == NULL) {
	ERROR("internal: no atom generated");
    }
    xmlFAParseQuantifier(ctxt);
    return(1);
}